

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::wsi::anon_unknown_0::TriangleRenderer::createFramebuffer
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkRenderPass renderPass,VkImageView colorAttachment,UVec2 *renderSize)

{
  undefined1 local_78 [8];
  VkFramebufferCreateInfo framebufferParams;
  UVec2 *renderSize_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkImageView colorAttachment_local;
  VkRenderPass renderPass_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferParams._4_4_ = 0;
  framebufferParams.pNext._0_4_ = 0;
  framebufferParams.renderPass.m_internal._0_4_ = 1;
  framebufferParams._32_8_ = &vkd_local;
  framebufferParams._16_8_ = renderPass.m_internal;
  framebufferParams._56_8_ = renderSize;
  vkd_local = (DeviceInterface *)colorAttachment.m_internal;
  colorAttachment_local.m_internal = renderPass.m_internal;
  framebufferParams.pAttachments._0_4_ = tcu::Vector<unsigned_int,_2>::x(renderSize);
  framebufferParams.pAttachments._4_4_ =
       tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)framebufferParams._56_8_);
  framebufferParams.width = 1;
  ::vk::createFramebuffer
            (__return_storage_ptr__,vkd,device,(VkFramebufferCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkFramebuffer> TriangleRenderer::createFramebuffer	(const DeviceInterface&		vkd,
														 const VkDevice				device,
														 const VkRenderPass			renderPass,
														 const VkImageView			colorAttachment,
														 const UVec2&				renderSize)
{
	const VkFramebufferCreateInfo	framebufferParams	=
	{
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,
		DE_NULL,
		(VkFramebufferCreateFlags)0,
		renderPass,
		1u,
		&colorAttachment,
		renderSize.x(),
		renderSize.y(),
		1u,							// layers
	};

	return vk::createFramebuffer(vkd, device, &framebufferParams);
}